

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

time_t mg_mgr_poll(mg_mgr *mgr,int milli)

{
  uint __fd;
  double dVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ssize_t sVar5;
  int iVar6;
  mg_connection *pmVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  mg_connection *pmVar11;
  bool bVar12;
  fd_set read_set;
  fd_set err_set;
  fd_set write_set;
  timeval tv;
  fd_set local_21c8;
  fd_set local_2148;
  fd_set local_20c8;
  timeval local_2040;
  code *local_2030;
  undefined1 local_2028 [8192];
  
  dVar1 = cs_time();
  local_21c8.fds_bits[0] = 0;
  local_21c8.fds_bits[1] = 0;
  local_21c8.fds_bits[2] = 0;
  local_21c8.fds_bits[3] = 0;
  local_21c8.fds_bits[4] = 0;
  local_21c8.fds_bits[5] = 0;
  local_21c8.fds_bits[6] = 0;
  local_21c8.fds_bits[7] = 0;
  local_21c8.fds_bits[8] = 0;
  local_21c8.fds_bits[9] = 0;
  local_21c8.fds_bits[10] = 0;
  local_21c8.fds_bits[0xb] = 0;
  local_21c8.fds_bits[0xc] = 0;
  local_21c8.fds_bits[0xd] = 0;
  local_21c8.fds_bits[0xe] = 0;
  local_21c8.fds_bits[0xf] = 0;
  local_20c8.fds_bits[0] = 0;
  local_20c8.fds_bits[1] = 0;
  local_20c8.fds_bits[2] = 0;
  local_20c8.fds_bits[3] = 0;
  local_20c8.fds_bits[4] = 0;
  local_20c8.fds_bits[5] = 0;
  local_20c8.fds_bits[6] = 0;
  local_20c8.fds_bits[7] = 0;
  local_20c8.fds_bits[8] = 0;
  local_20c8.fds_bits[9] = 0;
  local_20c8.fds_bits[10] = 0;
  local_20c8.fds_bits[0xb] = 0;
  local_20c8.fds_bits[0xc] = 0;
  local_20c8.fds_bits[0xd] = 0;
  local_20c8.fds_bits[0xe] = 0;
  local_20c8.fds_bits[0xf] = 0;
  local_2148.fds_bits[0] = 0;
  local_2148.fds_bits[1] = 0;
  local_2148.fds_bits[2] = 0;
  local_2148.fds_bits[3] = 0;
  local_2148.fds_bits[4] = 0;
  local_2148.fds_bits[5] = 0;
  local_2148.fds_bits[6] = 0;
  local_2148.fds_bits[7] = 0;
  local_2148.fds_bits[8] = 0;
  local_2148.fds_bits[9] = 0;
  local_2148.fds_bits[10] = 0;
  local_2148.fds_bits[0xb] = 0;
  local_2148.fds_bits[0xc] = 0;
  local_2148.fds_bits[0xd] = 0;
  local_2148.fds_bits[0xe] = 0;
  local_2148.fds_bits[0xf] = 0;
  iVar9 = mgr->ctl[1];
  if (iVar9 != -1) {
    iVar6 = iVar9 + 0x3f;
    if (-1 < iVar9) {
      iVar6 = iVar9;
    }
    local_21c8.fds_bits[iVar6 >> 6] = local_21c8.fds_bits[iVar6 >> 6] | 1L << ((byte)iVar9 & 0x3f);
  }
  pmVar11 = mgr->active_connections;
  while (pmVar7 = pmVar11, pmVar7 != (mg_connection *)0x0) {
    pmVar11 = pmVar7->next;
    iVar6 = pmVar7->sock;
    if (iVar6 == -1) {
      mg_mgr_handle_conn(pmVar7,0,dVar1);
    }
    else {
      uVar10 = pmVar7->flags;
      if ((((uVar10 & 0x40) == 0) && ((pmVar7->recv_mbuf).len < pmVar7->recv_mbuf_limit)) &&
         (((uVar10 & 2) == 0 || (pmVar7->listener == (mg_connection *)0x0)))) {
        iVar8 = iVar6 + 0x3f;
        if (-1 < iVar6) {
          iVar8 = iVar6;
        }
        local_21c8.fds_bits[iVar8 >> 6] =
             local_21c8.fds_bits[iVar8 >> 6] | 1L << ((byte)iVar6 & 0x3f);
        iVar8 = iVar6;
        if (iVar6 < iVar9) {
          iVar8 = iVar9;
        }
        bVar12 = iVar9 == -1;
        iVar9 = iVar8;
        if (bVar12) {
          iVar9 = iVar6;
        }
      }
      if ((((uint)uVar10 & 0x28) == 8) || (((uVar10 & 8) == 0 && ((pmVar7->send_mbuf).len != 0)))) {
        iVar8 = iVar6 + 0x3f;
        if (-1 < iVar6) {
          iVar8 = iVar6;
        }
        uVar10 = 1L << ((byte)iVar6 & 0x3f);
        local_20c8.fds_bits[iVar8 >> 6] = local_20c8.fds_bits[iVar8 >> 6] | uVar10;
        iVar2 = iVar6;
        if (iVar6 < iVar9) {
          iVar2 = iVar9;
        }
        bVar12 = iVar9 == -1;
        iVar9 = iVar2;
        if (bVar12) {
          iVar9 = iVar6;
        }
        local_2148.fds_bits[iVar8 >> 6] = local_2148.fds_bits[iVar8 >> 6] | uVar10;
      }
    }
  }
  local_2040.tv_sec = (__time_t)(milli / 1000);
  local_2040.tv_usec = (__suseconds_t)((milli % 1000) * 1000);
  uVar3 = select(iVar9 + 1,&local_21c8,&local_20c8,&local_2148,&local_2040);
  dVar1 = cs_time();
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_mgr_poll");
    cs_log_printf("select @ %ld num_ev=%d of %d",(long)dVar1,(ulong)uVar3);
  }
  if (0 < (int)uVar3) {
    __fd = mgr->ctl[1];
    if (__fd != 0xffffffff) {
      uVar4 = __fd + 0x3f;
      if (-1 < (int)__fd) {
        uVar4 = __fd;
      }
      if (((ulong)local_21c8.fds_bits[(int)uVar4 >> 6] >> ((ulong)__fd & 0x3f) & 1) != 0) {
        sVar5 = recv(__fd,&local_2030,0x2008,0);
        send(mgr->ctl[1],local_2028,1,0);
        if (LL_DEBUG < s_cs_log_level) {
          mg_mgr_poll_cold_1();
        }
        if ((7 < (int)sVar5) && (local_2030 != (code *)0x0)) {
          for (pmVar11 = mgr->active_connections; pmVar11 != (mg_connection *)0x0;
              pmVar11 = pmVar11->next) {
            (*local_2030)(pmVar11,0,local_2028);
          }
        }
      }
    }
  }
  pmVar11 = mgr->active_connections;
  if (mgr->active_connections != (mg_connection *)0x0) {
    do {
      if ((int)uVar3 < 1) {
        iVar9 = 0;
      }
      else {
        iVar9 = pmVar11->sock;
        iVar6 = iVar9 + 0x3f;
        if (-1 < iVar9) {
          iVar6 = iVar9;
        }
        iVar6 = iVar6 >> 6;
        uVar10 = (ulong)(uint)(iVar9 % 0x40);
        iVar9 = (uint)(((ulong)local_21c8.fds_bits[iVar6] >> (uVar10 & 0x3f) & 1) != 0) +
                (uint)(((ulong)local_20c8.fds_bits[iVar6] >> (uVar10 & 0x3f) & 1) != 0) * 2 +
                (uint)(((ulong)local_2148.fds_bits[iVar6] >> (uVar10 & 0x3f) & 1) != 0) * 4;
      }
      pmVar7 = pmVar11->next;
      mg_mgr_handle_conn(pmVar11,iVar9,dVar1);
      pmVar11 = pmVar7;
    } while (pmVar7 != (mg_connection *)0x0);
    pmVar11 = mgr->active_connections;
    while (pmVar7 = pmVar11, pmVar7 != (mg_connection *)0x0) {
      pmVar11 = pmVar7->next;
      uVar3 = (uint)pmVar7->flags;
      if (((uVar3 >> 0xb & 1) != 0) || (((uVar3 >> 10 & 1) != 0 && ((pmVar7->send_mbuf).len == 0))))
      {
        mg_close_conn(pmVar7);
      }
    }
  }
  return (long)dVar1;
}

Assistant:

time_t mg_mgr_poll(struct mg_mgr *mgr, int milli) {
    double now = mg_time();
    struct mg_connection *nc, *tmp;
    struct timeval tv;
    fd_set read_set, write_set, err_set;
    sock_t max_fd = INVALID_SOCKET;
    int num_fds, num_selected;

    FD_ZERO(&read_set);
    FD_ZERO(&write_set);
    FD_ZERO(&err_set);
#ifndef MG_DISABLE_SOCKETPAIR
    mg_add_to_set(mgr->ctl[1], &read_set, &max_fd);
#endif

    for (nc = mgr->active_connections, num_fds = 0; nc != NULL; nc = tmp) {
        tmp = nc->next;

        if (nc->sock == INVALID_SOCKET) {
            mg_mgr_handle_conn(nc, 0, now);
            continue;
        }

        num_fds++;

        if (!(nc->flags & MG_F_WANT_WRITE) &&
            nc->recv_mbuf.len < nc->recv_mbuf_limit &&
            (!(nc->flags & MG_F_UDP) || nc->listener == NULL)) {
            mg_add_to_set(nc->sock, &read_set, &max_fd);
        }

        if (((nc->flags & MG_F_CONNECTING) && !(nc->flags & MG_F_WANT_READ)) ||
            (nc->send_mbuf.len > 0 && !(nc->flags & MG_F_CONNECTING))) {
            mg_add_to_set(nc->sock, &write_set, &max_fd);
            mg_add_to_set(nc->sock, &err_set, &max_fd);
        }
    }

    tv.tv_sec = milli / 1000;
    tv.tv_usec = (milli % 1000) * 1000;

    num_selected = select((int) max_fd + 1, &read_set, &write_set, &err_set, &tv);
    now = mg_time();
    DBG(("select @ %ld num_ev=%d of %d", (long) now, num_selected, num_fds));

#ifndef MG_DISABLE_SOCKETPAIR
    if (num_selected > 0 && mgr->ctl[1] != INVALID_SOCKET &&
        FD_ISSET(mgr->ctl[1], &read_set)) {
        mg_mgr_handle_ctl_sock(mgr);
    }
#endif

    for (nc = mgr->active_connections; nc != NULL; nc = tmp) {
        int fd_flags = 0;
        if (num_selected > 0) {
            fd_flags = (FD_ISSET(nc->sock, &read_set) ? _MG_F_FD_CAN_READ : 0) |
                       (FD_ISSET(nc->sock, &write_set) ? _MG_F_FD_CAN_WRITE : 0) |
                       (FD_ISSET(nc->sock, &err_set) ? _MG_F_FD_ERROR : 0);
        }
#ifdef MG_CC3200
                                                                                                                                // CC3200 does not report UDP sockets as writeable.
    if (nc->flags & MG_F_UDP &&
        (nc->send_mbuf.len > 0 || nc->flags & MG_F_CONNECTING)) {
      fd_flags |= _MG_F_FD_CAN_WRITE;
    }
#endif
#ifdef MG_LWIP
                                                                                                                                /* With LWIP socket emulation layer, we don't get write events */
    fd_flags |= _MG_F_FD_CAN_WRITE;
#endif
        tmp = nc->next;
        mg_mgr_handle_conn(nc, fd_flags, now);
    }

    for (nc = mgr->active_connections; nc != NULL; nc = tmp) {
        tmp = nc->next;
        if ((nc->flags & MG_F_CLOSE_IMMEDIATELY) ||
            (nc->send_mbuf.len == 0 && (nc->flags & MG_F_SEND_AND_CLOSE))) {
            mg_close_conn(nc);
        }
    }

    return now;
}